

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.h
# Opt level: O2

void __thiscall OutputStream::grow(OutputStream *this,size_t N)

{
  ulong uVar1;
  char *pcVar2;
  ulong __size;
  
  uVar1 = N + this->CurrentPosition;
  if (this->BufferCapacity <= uVar1) {
    __size = this->BufferCapacity * 2;
    if (__size <= uVar1) {
      __size = uVar1;
    }
    this->BufferCapacity = __size;
    pcVar2 = (char *)realloc(this->Buffer,__size);
    this->Buffer = pcVar2;
    if (pcVar2 == (char *)0x0) {
      std::terminate();
    }
  }
  return;
}

Assistant:

void grow(size_t N) {
    if (N + CurrentPosition >= BufferCapacity) {
      BufferCapacity *= 2;
      if (BufferCapacity < N + CurrentPosition)
        BufferCapacity = N + CurrentPosition;
      Buffer = static_cast<char *>(std::realloc(Buffer, BufferCapacity));
      if (Buffer == nullptr)
        std::terminate();
    }
  }